

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::generateGeneric
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  long lVar1;
  ulong uVar2;
  OSAttribute *this_00;
  byte bVar3;
  int iVar4;
  uint uVar5;
  CryptoFactory *pCVar6;
  undefined4 extraout_var;
  long *plVar7;
  ulong in_RCX;
  undefined8 *puVar8;
  long in_RDX;
  long *in_R8;
  bool bVar9;
  char in_stack_00000008;
  int in_stack_00000014;
  CK_OBJECT_HANDLE_PTR in_stack_00000018;
  CK_ULONG in_stack_00000020;
  CK_ATTRIBUTE_PTR in_stack_00000028;
  CK_SESSION_HANDLE in_stack_00000030;
  SoftHSM *in_stack_00000038;
  OSObject *oskey;
  SymmetricKey symKey;
  ByteString kcv;
  ByteString value;
  bool bNeverExtractable;
  bool bAlwaysSensitive;
  CK_ULONG ulKeyGenMechanism;
  bool bOK;
  OSObject *osobject;
  CK_ULONG i_1;
  CK_ULONG keyAttribsCount;
  CK_ATTRIBUTE keyAttribs [32];
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  CK_ULONG maxAttribs;
  CK_RV rv;
  ByteString key;
  RNG *rng;
  CK_ULONG i;
  bool checkValue;
  size_t keyLen;
  Token *token;
  Session *session;
  ByteString *in_stack_fffffffffffff658;
  undefined6 in_stack_fffffffffffff660;
  byte in_stack_fffffffffffff666;
  byte in_stack_fffffffffffff667;
  SymmetricKey *in_stack_fffffffffffff668;
  HandleManager *pHVar10;
  undefined6 in_stack_fffffffffffff670;
  undefined1 in_stack_fffffffffffff676;
  undefined1 in_stack_fffffffffffff677;
  byte local_979;
  ByteString *in_stack_fffffffffffff688;
  OSAttribute *in_stack_fffffffffffff690;
  ByteString *in_stack_fffffffffffff6a0;
  undefined7 in_stack_fffffffffffff6a8;
  byte in_stack_fffffffffffff6af;
  undefined5 in_stack_fffffffffffff6b8;
  byte in_stack_fffffffffffff6bd;
  undefined1 in_stack_fffffffffffff6be;
  byte in_stack_fffffffffffff6bf;
  HandleManager *in_stack_fffffffffffff6c0;
  byte local_933;
  byte local_922;
  undefined1 *local_8e8;
  undefined1 local_8b0 [167];
  byte local_809;
  undefined1 local_808 [200];
  char local_740 [40];
  SymmetricKey local_718;
  undefined1 local_6b8 [47];
  byte local_689;
  undefined1 local_688 [166];
  undefined1 local_5e2;
  byte local_5e1;
  undefined1 local_5e0 [166];
  byte local_53a;
  byte local_539;
  undefined1 local_538 [160];
  undefined8 local_498;
  byte local_489;
  undefined1 local_488 [167];
  byte local_3e1;
  HandleManager *local_3e0;
  ulong local_3d8;
  long local_3d0;
  undefined1 *local_3c8 [5];
  undefined8 local_3a0;
  undefined8 local_398;
  undefined1 *local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 *local_378;
  undefined8 local_370;
  undefined1 local_368 [672];
  undefined1 auStack_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  CK_RV local_a8;
  undefined4 local_a0;
  undefined1 local_90 [40];
  long *local_68;
  ulong local_60;
  byte local_51;
  ulong local_50;
  OSAttribute *local_48;
  Session *local_40;
  undefined1 local_31;
  long *local_30;
  ulong local_28;
  long local_20;
  CK_RV local_8;
  
  *in_R8 = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_40 = (Session *)
             HandleManager::getSession
                       ((HandleManager *)
                        CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8),
                        (CK_SESSION_HANDLE)in_stack_fffffffffffff6a0);
  if (local_40 == (Session *)0x0) {
    local_8 = 0xb3;
  }
  else {
    local_48 = (OSAttribute *)Session::getToken(local_40);
    if (local_48 == (OSAttribute *)0x0) {
      local_8 = 5;
    }
    else {
      local_50 = 0;
      local_51 = 1;
      for (local_60 = 0; local_60 < local_28; local_60 = local_60 + 1) {
        lVar1 = *(long *)(local_20 + local_60 * 0x18);
        if (lVar1 == 0x90) {
          if (*(long *)(local_20 + local_60 * 0x18 + 0x10) != 0) {
            softHSMLog(6,"generateGeneric",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x1d7d,"CKA_CHECK_VALUE must be a no-value (0 length) entry");
            return 0x13;
          }
          local_51 = 0;
        }
        else if (lVar1 == 0x161) {
          if (*(long *)(local_20 + local_60 * 0x18 + 0x10) != 8) {
            softHSMLog(6,"generateGeneric",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x1d75,"CKA_VALUE_LEN does not have the size of CK_ULONG");
            return 0x13;
          }
          local_50 = **(ulong **)(local_20 + local_60 * 0x18 + 8);
        }
      }
      if (local_50 == 0) {
        softHSMLog(6,"generateGeneric",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x1d8a,"Missing CKA_VALUE_LEN in pTemplate");
        local_8 = 0xd0;
      }
      else if ((local_50 == 0) || (0x8000000 < local_50)) {
        softHSMLog(6,"generateGeneric",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x1d91,"bad generic key length");
        local_8 = 0x13;
      }
      else {
        pCVar6 = CryptoFactory::i();
        iVar4 = (*pCVar6->_vptr_CryptoFactory[8])(pCVar6,1);
        local_68 = (long *)CONCAT44(extraout_var,iVar4);
        if (local_68 == (long *)0x0) {
          local_8 = 5;
        }
        else {
          ByteString::ByteString((ByteString *)0x17ad8e);
          bVar3 = (**(code **)(*local_68 + 0x10))(local_68,local_90,local_50);
          if ((bVar3 & 1) == 0) {
            local_8 = 5;
          }
          else {
            local_a8 = 0;
            local_b0 = 0x20;
            local_b8 = 4;
            local_c0 = 0x10;
            memset(local_3c8,0,0x300);
            local_3c8[1] = (undefined1 *)&local_b8;
            local_3c8[2] = (undefined1 *)0x8;
            local_3c8[3] = (undefined1 *)0x1;
            local_3c8[4] = &local_31;
            local_3a0 = 1;
            local_398 = 2;
            local_390 = &stack0x00000008;
            local_388 = 1;
            local_380 = 0x100;
            local_378 = &local_c0;
            local_370 = 8;
            local_8e8 = local_368;
            do {
              local_8e8 = local_8e8 + 0x18;
            } while (local_8e8 != auStack_c8);
            local_3d0 = 4;
            if (0x1c < local_28) {
              local_a8 = 0xd1;
            }
            for (local_3d8 = 0; local_3d8 < local_28 && local_a8 == 0; local_3d8 = local_3d8 + 1) {
              uVar2 = *(ulong *)(local_20 + local_3d8 * 0x18);
              if (((2 < uVar2) && (uVar2 != 0x90)) && (uVar2 != 0x100)) {
                puVar8 = (undefined8 *)(local_20 + local_3d8 * 0x18);
                local_3c8[local_3d0 * 3] = (undefined1 *)*puVar8;
                local_3c8[local_3d0 * 3 + 1] = (undefined1 *)puVar8[1];
                local_3c8[local_3d0 * 3 + 2] = (undefined1 *)puVar8[2];
                local_3d0 = local_3d0 + 1;
              }
            }
            if (local_a8 == 0) {
              local_a8 = CreateObject(in_stack_00000038,in_stack_00000030,in_stack_00000028,
                                      in_stack_00000020,in_stack_00000018,in_stack_00000014);
            }
            if (local_a8 == 0) {
              local_3e0 = (HandleManager *)
                          HandleManager::getObject
                                    ((HandleManager *)
                                     CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8),
                                     (CK_OBJECT_HANDLE)in_stack_fffffffffffff6a0);
              if ((local_3e0 == (HandleManager *)0x0) ||
                 (uVar5 = (*local_3e0->_vptr_HandleManager[10])(), (uVar5 & 1) == 0)) {
                local_a8 = 6;
              }
              else {
                uVar5 = (*local_3e0->_vptr_HandleManager[0xb])(local_3e0,1);
                pHVar10 = local_3e0;
                if ((uVar5 & 1) == 0) {
                  local_a8 = 6;
                }
                else {
                  local_3e1 = 1;
                  local_489 = 0;
                  OSAttribute::OSAttribute
                            ((OSAttribute *)
                             CONCAT17(in_stack_fffffffffffff667,
                                      CONCAT16(in_stack_fffffffffffff666,in_stack_fffffffffffff660))
                             ,SUB81((ulong)in_stack_fffffffffffff658 >> 0x38,0));
                  local_489 = 1;
                  iVar4 = (*pHVar10->_vptr_HandleManager[8])(pHVar10,0x163,local_488);
                  local_3e1 = (byte)iVar4 & 1;
                  if ((local_489 & 1) != 0) {
                    OSAttribute::~OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff667,
                                        CONCAT16(in_stack_fffffffffffff666,in_stack_fffffffffffff660
                                                )));
                  }
                  pHVar10 = local_3e0;
                  local_498 = 0x350;
                  local_539 = 0;
                  local_922 = 0;
                  if ((local_3e1 & 1) != 0) {
                    OSAttribute::OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff667,
                                        CONCAT16(in_stack_fffffffffffff666,in_stack_fffffffffffff660
                                                )),(unsigned_long)in_stack_fffffffffffff658);
                    local_539 = 1;
                    iVar4 = (*pHVar10->_vptr_HandleManager[8])(pHVar10,0x166,local_538);
                    local_922 = (byte)iVar4;
                  }
                  local_3e1 = local_922 & 1;
                  if ((local_539 & 1) != 0) {
                    OSAttribute::~OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff667,
                                        CONCAT16(in_stack_fffffffffffff666,in_stack_fffffffffffff660
                                                )));
                  }
                  iVar4 = (*local_3e0->_vptr_HandleManager[4])(local_3e0,0x103,0);
                  local_53a = (byte)iVar4 & 1;
                  local_5e1 = 0;
                  local_933 = 0;
                  if ((local_3e1 & 1) != 0) {
                    in_stack_fffffffffffff6c0 = local_3e0;
                    OSAttribute::OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff667,
                                        CONCAT16(in_stack_fffffffffffff666,in_stack_fffffffffffff660
                                                )),SUB81((ulong)in_stack_fffffffffffff658 >> 0x38,0)
                              );
                    local_5e1 = 1;
                    iVar4 = (*in_stack_fffffffffffff6c0->_vptr_HandleManager[8])
                                      (in_stack_fffffffffffff6c0,0x165,local_5e0);
                    in_stack_fffffffffffff6bf = (byte)iVar4;
                    local_933 = in_stack_fffffffffffff6bf;
                  }
                  local_3e1 = local_933 & 1;
                  if ((local_5e1 & 1) != 0) {
                    OSAttribute::~OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff667,
                                        CONCAT16(in_stack_fffffffffffff666,in_stack_fffffffffffff660
                                                )));
                  }
                  uVar5 = (*local_3e0->_vptr_HandleManager[4])(local_3e0,0x162,0);
                  pHVar10 = local_3e0;
                  in_stack_fffffffffffff6be = (undefined1)uVar5;
                  local_5e2 = (uVar5 & 1) == 0;
                  local_689 = 0;
                  in_stack_fffffffffffff6bd = 0;
                  if ((local_3e1 & 1) != 0) {
                    OSAttribute::OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff667,
                                        CONCAT16(in_stack_fffffffffffff666,in_stack_fffffffffffff660
                                                )),SUB81((ulong)in_stack_fffffffffffff658 >> 0x38,0)
                              );
                    local_689 = 1;
                    iVar4 = (*pHVar10->_vptr_HandleManager[8])(pHVar10,0x164,local_688);
                    in_stack_fffffffffffff6af = (byte)iVar4;
                    in_stack_fffffffffffff6bd = in_stack_fffffffffffff6af;
                  }
                  local_3e1 = in_stack_fffffffffffff6bd & 1;
                  if ((local_689 & 1) != 0) {
                    OSAttribute::~OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff667,
                                        CONCAT16(in_stack_fffffffffffff666,in_stack_fffffffffffff660
                                                )));
                  }
                  ByteString::ByteString((ByteString *)0x17b461);
                  ByteString::ByteString((ByteString *)0x17b470);
                  SymmetricKey::SymmetricKey
                            ((SymmetricKey *)
                             CONCAT17(in_stack_fffffffffffff677,
                                      CONCAT16(in_stack_fffffffffffff676,in_stack_fffffffffffff670))
                             ,(size_t)in_stack_fffffffffffff668);
                  SymmetricKey::setKeyBits
                            (in_stack_fffffffffffff668,
                             (ByteString *)
                             CONCAT17(in_stack_fffffffffffff667,
                                      CONCAT16(in_stack_fffffffffffff666,in_stack_fffffffffffff660))
                            );
                  SymmetricKey::setBitLen(&local_718,local_50);
                  this_00 = local_48;
                  if (in_stack_00000008 == '\0') {
                    in_stack_fffffffffffff688 = SymmetricKey::getKeyBits(&local_718);
                    ByteString::operator=
                              ((ByteString *)
                               CONCAT17(in_stack_fffffffffffff667,
                                        CONCAT16(in_stack_fffffffffffff666,in_stack_fffffffffffff660
                                                )),in_stack_fffffffffffff658);
                    SymmetricKey::getKeyCheckValue
                              ((SymmetricKey *)
                               CONCAT17(in_stack_fffffffffffff6bf,
                                        CONCAT16(in_stack_fffffffffffff6be,
                                                 CONCAT15(in_stack_fffffffffffff6bd,
                                                          in_stack_fffffffffffff6b8))));
                    ByteString::operator=
                              ((ByteString *)
                               CONCAT17(in_stack_fffffffffffff667,
                                        CONCAT16(in_stack_fffffffffffff666,in_stack_fffffffffffff660
                                                )),in_stack_fffffffffffff658);
                    ByteString::~ByteString((ByteString *)0x17b6e9);
                  }
                  else {
                    in_stack_fffffffffffff6a0 = SymmetricKey::getKeyBits(&local_718);
                    Token::encrypt((Token *)this_00,(char *)in_stack_fffffffffffff6a0,(int)local_6b8
                                  );
                    in_stack_fffffffffffff690 = local_48;
                    SymmetricKey::getKeyCheckValue
                              ((SymmetricKey *)
                               CONCAT17(in_stack_fffffffffffff6bf,
                                        CONCAT16(in_stack_fffffffffffff6be,
                                                 CONCAT15(in_stack_fffffffffffff6bd,
                                                          in_stack_fffffffffffff6b8))));
                    Token::encrypt((Token *)in_stack_fffffffffffff690,local_740,
                                   (int)&stack0xfffffffffffff920);
                    ByteString::~ByteString((ByteString *)0x17b548);
                  }
                  pHVar10 = local_3e0;
                  local_809 = 0;
                  local_979 = 0;
                  if ((local_3e1 & 1) != 0) {
                    OSAttribute::OSAttribute(in_stack_fffffffffffff690,in_stack_fffffffffffff688);
                    local_809 = 1;
                    iVar4 = (*pHVar10->_vptr_HandleManager[8])(pHVar10,0x11,local_808);
                    local_979 = (byte)iVar4;
                  }
                  local_3e1 = local_979 & 1;
                  if ((local_809 & 1) != 0) {
                    OSAttribute::~OSAttribute
                              ((OSAttribute *)
                               CONCAT17(in_stack_fffffffffffff667,
                                        CONCAT16(in_stack_fffffffffffff666,in_stack_fffffffffffff660
                                                )));
                  }
                  if ((local_51 & 1) != 0) {
                    bVar9 = (local_3e1 & 1) != 0;
                    bVar3 = 0;
                    if (bVar9) {
                      pHVar10 = local_3e0;
                      OSAttribute::OSAttribute(in_stack_fffffffffffff690,in_stack_fffffffffffff688);
                      iVar4 = (*pHVar10->_vptr_HandleManager[8])(pHVar10,0x90,local_8b0);
                      in_stack_fffffffffffff667 = (byte)iVar4;
                      bVar3 = in_stack_fffffffffffff667;
                    }
                    local_3e1 = bVar3 & 1;
                    if (bVar9) {
                      OSAttribute::~OSAttribute
                                ((OSAttribute *)
                                 CONCAT17(in_stack_fffffffffffff667,
                                          CONCAT16(in_stack_fffffffffffff666,
                                                   in_stack_fffffffffffff660)));
                    }
                  }
                  if ((local_3e1 & 1) == 0) {
                    (*local_3e0->_vptr_HandleManager[0xd])();
                  }
                  else {
                    iVar4 = (*local_3e0->_vptr_HandleManager[0xc])();
                    in_stack_fffffffffffff666 = (byte)iVar4;
                    local_3e1 = in_stack_fffffffffffff666 & 1;
                  }
                  if ((local_3e1 & 1) == 0) {
                    local_a8 = 6;
                  }
                  SymmetricKey::~SymmetricKey
                            ((SymmetricKey *)
                             CONCAT17(in_stack_fffffffffffff667,
                                      CONCAT16(in_stack_fffffffffffff666,in_stack_fffffffffffff660))
                            );
                  ByteString::~ByteString((ByteString *)0x17b928);
                  ByteString::~ByteString((ByteString *)0x17b935);
                }
              }
            }
            if ((local_a8 != 0) && (*local_30 != 0)) {
              plVar7 = (long *)HandleManager::getObject
                                         ((HandleManager *)
                                          CONCAT17(in_stack_fffffffffffff6af,
                                                   in_stack_fffffffffffff6a8),
                                          (CK_OBJECT_HANDLE)in_stack_fffffffffffff6a0);
              HandleManager::destroyObject
                        (in_stack_fffffffffffff6c0,
                         CONCAT17(in_stack_fffffffffffff6bf,
                                  CONCAT16(in_stack_fffffffffffff6be,
                                           CONCAT15(in_stack_fffffffffffff6bd,
                                                    in_stack_fffffffffffff6b8))));
              if (plVar7 != (long *)0x0) {
                (**(code **)(*plVar7 + 0x70))();
              }
              *local_30 = 0;
            }
            local_8 = local_a8;
          }
          local_a0 = 1;
          ByteString::~ByteString((ByteString *)0x17ba35);
        }
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::generateGeneric
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	size_t keyLen = 0;
	bool checkValue = true;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_VALUE_LEN:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_VALUE_LEN does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				keyLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			case CKA_CHECK_VALUE:
				if (pTemplate[i].ulValueLen > 0)
				{
					INFO_MSG("CKA_CHECK_VALUE must be a no-value (0 length) entry");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				checkValue = false;
				break;
			default:
				break;
		}
	}

	// CKA_VALUE_LEN must be specified
	if (keyLen == 0)
	{
		INFO_MSG("Missing CKA_VALUE_LEN in pTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// Check keyLen
	if (keyLen < 1 || keyLen > 0x8000000)
	{
		INFO_MSG("bad generic key length");
		return CKR_ATTRIBUTE_VALUE_INVALID;
	}

	// Generate the secret key
	RNG* rng = CryptoFactory::i()->getRNG();
	if (rng == NULL) return CKR_GENERAL_ERROR;
	ByteString key;
	if (!rng->generateRandom(key, keyLen)) return CKR_GENERAL_ERROR;

        CK_RV rv = CKR_OK;

	// Create the secret key object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_SECRET_KEY;
	CK_KEY_TYPE keyType = CKK_GENERIC_SECRET;
	CK_ATTRIBUTE keyAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG keyAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - keyAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
			case CKA_CHECK_VALUE:
				continue;
			default:
				keyAttribs[keyAttribsCount++] = pTemplate[i];
				break;
		}
	}

	if (rv == CKR_OK)
		rv = CreateObject(hSession, keyAttribs, keyAttribsCount, phKey, OBJECT_OP_GENERATE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
			CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_GENERIC_SECRET_KEY_GEN;
			bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

			// Common Secret Key Attributes
			bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
			bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
			bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
			bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

			// Generic Secret Key Attributes
			ByteString value;
			ByteString kcv;
			SymmetricKey symKey;
			symKey.setKeyBits(key);
			symKey.setBitLen(keyLen);
			if (isPrivate)
			{
				token->encrypt(symKey.getKeyBits(), value);
				token->encrypt(symKey.getKeyCheckValue(), kcv);
			}
			else
			{
				value = symKey.getKeyBits();
				kcv = symKey.getKeyCheckValue();
			}
			bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			if (checkValue)
				bOK = bOK && osobject->setAttribute(CKA_CHECK_VALUE, kcv);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	// Remove the key that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* oskey = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (oskey) oskey->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}